

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

DataSegment * __thiscall
wasm::Module::addDataSegment
          (Module *this,unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *curr
          )

{
  DataSegment *pDVar1;
  allocator<char> local_41;
  string local_40;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> local_20;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *local_18;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)this;
  std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::unique_ptr
            (&local_20,curr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"addDataSegment",&local_41)
  ;
  pDVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>,std::allocator<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>>>,std::unordered_map<wasm::Name,wasm::DataSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DataSegment*>>>,wasm::DataSegment>
                     (&this->dataSegments,&this->dataSegmentsMap,&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
            (&local_20);
  return pDVar1;
}

Assistant:

DataSegment* Module::addDataSegment(std::unique_ptr<DataSegment>&& curr) {
  return addModuleElement(
    dataSegments, dataSegmentsMap, std::move(curr), "addDataSegment");
}